

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O2

void test_ecc_weierstrass_decompress(void)

{
  mp_int *in_RAX;
  WeierstrassCurve *wc;
  mp_int *xorig;
  WeierstrassPoint *pWVar1;
  size_t sVar2;
  size_t i;
  ulong index;
  size_t p;
  ulong uVar3;
  mp_int *X;
  
  X = in_RAX;
  wc = wcurve();
  xorig = mp_new(0x90);
  pWVar1 = ecc_weierstrass_point_new_from_x(wc,xorig,0);
  if (pWVar1 != (WeierstrassPoint *)0x0) {
    ecc_weierstrass_point_free(pWVar1);
  }
  uVar3 = 0;
  while( true ) {
    sVar2 = (*looplimit)(2);
    if (sVar2 <= uVar3) break;
    index = 1;
    while( true ) {
      sVar2 = (*looplimit)(5);
      if (sVar2 <= index) break;
      pWVar1 = wpoint(wc,index);
      ecc_weierstrass_get_affine(pWVar1,&X,(mp_int **)0x0);
      mp_copy_into(xorig,X);
      mp_free(X);
      ecc_weierstrass_point_free(pWVar1);
      log_start();
      pWVar1 = ecc_weierstrass_point_new_from_x(wc,xorig,(uint)uVar3);
      log_end();
      ecc_weierstrass_point_free(pWVar1);
      index = index + 1;
    }
    uVar3 = uVar3 + 1;
  }
  mp_free(xorig);
  ecc_weierstrass_curve_free(wc);
  return;
}

Assistant:

static void test_ecc_weierstrass_decompress(void)
{
    WeierstrassCurve *wc = wcurve();

    /* As in the mp_modsqrt test, prime the lazy initialisation of the
     * ModsqrtContext */
    mp_int *x = mp_new(144);
    WeierstrassPoint *a = ecc_weierstrass_point_new_from_x(wc, x, 0);
    if (a)                 /* don't care whether this one succeeded */
        ecc_weierstrass_point_free(a);

    for (size_t p = 0; p < looplimit(2); p++) {
        for (size_t i = 1; i < looplimit(5); i++) {
            WeierstrassPoint *A = wpoint(wc, i);
            mp_int *X;
            ecc_weierstrass_get_affine(A, &X, NULL);
            mp_copy_into(x, X);
            mp_free(X);
            ecc_weierstrass_point_free(A);

            log_start();
            WeierstrassPoint *a = ecc_weierstrass_point_new_from_x(wc, x, p);
            log_end();

            ecc_weierstrass_point_free(a);
        }
    }
    mp_free(x);
    ecc_weierstrass_curve_free(wc);
}